

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QFileSystemModel::sibling(QFileSystemModel *this,int row,int column,QModelIndex *idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  uint in_EDX;
  long *in_RSI;
  QModelIndex *in_RDI;
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffa4;
  QModelIndex *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QModelIndex::row(in_R8);
  bVar1 = false;
  if (in_EDX == uVar2) {
    in_stack_ffffffffffffffa4 = in_ECX;
    QModelIndex::parent(this_00);
    iVar3 = (**(code **)(*in_RSI + 0x80))(in_RSI,local_20);
    bVar1 = in_stack_ffffffffffffffa4 < iVar3;
  }
  if (bVar1) {
    QModelIndex::internalPointer(in_R8);
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (void *)CONCAT44(in_stack_ffffffffffffffa4,in_ECX));
  }
  else {
    QAbstractItemModel::sibling((int)in_RDI,(int)in_RSI,(QModelIndex *)(ulong)in_EDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QFileSystemModel::sibling(int row, int column, const QModelIndex &idx) const
{
    if (row == idx.row() && column < columnCount(idx.parent())) {
        // cheap sibling operation: just adjust the column:
        return createIndex(row, column, idx.internalPointer());
    } else {
        // for anything else: call the default implementation
        // (this could probably be optimized, too):
        return QAbstractItemModel::sibling(row, column, idx);
    }
}